

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::CameraBase::InitMetadata(CameraBase *this,ImageMetadata *metadata)

{
  Transform local_90;
  
  CameraTransform::CameraFromWorld(&local_90,&this->cameraTransform,this->shutterOpen);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=(&metadata->cameraFromWorld,&local_90.m);
  return;
}

Assistant:

void CameraBase::InitMetadata(ImageMetadata *metadata) const {
    metadata->cameraFromWorld = cameraTransform.CameraFromWorld(shutterOpen).GetMatrix();
}